

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O2

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
PlainObjectBase<Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<bool,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,double,(Eigen::internal::ComparisonName)1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,_1,0,_1,_1>>const,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,_1,0,_1,_1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,_1,0,_1,_1>>const>const>>
          (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          DenseBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<bool,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>_>_>_>
          *other)

{
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  resizeLike<Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<bool,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,double,(Eigen::internal::ComparisonName)1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,_1,0,_1,_1>>const,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,_1,0,_1,_1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,_1,0,_1,_1>>const>const>>
            (this,(EigenBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<bool,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,__1,__1,_0,__1,__1>_>_>_>_>
                   *)other);
  _set_noalias<Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<bool,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,double,(Eigen::internal::ComparisonName)1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,_1,0,_1,_1>>const,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,_1,0,_1,_1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,_1,0,_1,_1>>const>const>>
            (this,other);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
    EIGEN_STRONG_INLINE PlainObjectBase(const DenseBase<OtherDerived> &other)
      : m_storage()
    {
      _check_template_params();
      resizeLike(other);
      _set_noalias(other);
    }